

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LUX_Run03.hh
# Opt level: O1

double __thiscall
DetectorExample_LUX_RUN03::FitEF
          (DetectorExample_LUX_RUN03 *this,double xPos_mm,double yPos_mm,double zPos_mm)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = pow(zPos_mm,3.0);
  dVar2 = pow(zPos_mm,4.0);
  dVar3 = pow(zPos_mm,5.0);
  dVar1 = dVar3 * -1.011e-11 +
          dVar2 * 1.5049e-08 +
          dVar1 * -8.7098e-06 + zPos_mm * zPos_mm * 0.0024485 + zPos_mm * -0.2209 + 158.92;
  if ((dVar1 <= 1.0) || (100000.0 < dVar1)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "ERR: Very weird drift electric field value!! Are you sure you didn\'t forget to change LUX numbers for your own detector??"
               ,0x79);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
    dVar1 = 1.0;
  }
  return dVar1;
}

Assistant:

double FitEF(double xPos_mm, double yPos_mm,
               double zPos_mm) override {  // in V/cm

    double finalEF =
        158.92  // NOTE: DO NOT JUST RETURN A CONSTANT, THAT IS A SILLY USE of
                // FitEF
        - 0.2209000 * pow(zPos_mm, 1.) + 0.0024485 * pow(zPos_mm, 2.) -
        8.7098e-6 * pow(zPos_mm, 3.) + 1.5049e-8 * pow(zPos_mm, 4.) -
        1.0110e-11 * pow(zPos_mm, 5.);
    if (finalEF <= FIELD_MIN || finalEF > 1e5 || std::isnan(finalEF)) {
      cerr << "ERR: Very weird drift electric field value!! Are you sure you "
              "didn't forget to change LUX numbers for your own detector??"
           << endl;
      return FIELD_MIN;
    } else
      return finalEF;
  }